

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.cpp
# Opt level: O3

Variable __thiscall LiteScript::State::GetArg(State *this,uint i)

{
  long lVar1;
  ulong in_RDX;
  uint *extraout_RDX;
  undefined4 in_register_00000034;
  long lVar3;
  Variable VVar4;
  uint *puVar2;
  
  lVar3 = CONCAT44(in_register_00000034,i);
  lVar1 = *(long *)(lVar3 + 0x50);
  if (lVar1 != *(long *)(lVar3 + 0x48)) {
    if ((in_RDX & 0xffffffff) < (ulong)(*(long *)(lVar1 + -0x10) - *(long *)(lVar1 + -0x18) >> 4)) {
      Variable::Variable((Variable *)this,
                         (Variable *)(*(long *)(lVar1 + -0x18) + (in_RDX & 0xffffffff) * 0x10));
      puVar2 = extraout_RDX;
      goto LAB_0012e341;
    }
  }
  VVar4 = Memory::Create((Memory *)this,*(Type **)(lVar3 + 0xd8));
  puVar2 = VVar4.nb_ref;
LAB_0012e341:
  VVar4.nb_ref = puVar2;
  VVar4.obj = (Object *)this;
  return VVar4;
}

Assistant:

LiteScript::Variable LiteScript::State::GetArg(unsigned int i) const {
    if (this->args_def.size() > 0 && this->args_def.back().size() > i)
        return Variable(this->args_def.back().at(i));
    else
        return this->memory.Create(Type::UNDEFINED);
}